

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridge.cpp
# Opt level: O0

Belief * __thiscall despot::Bridge::Tau(Bridge *this,Belief *belief,ACT_TYPE action,OBS_TYPE obs)

{
  int iVar1;
  int iVar2;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this_00;
  size_type sVar3;
  const_reference ppSVar4;
  reference pvVar5;
  ParticleBelief *pPVar6;
  pointer ppSVar7;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_b8;
  value_type local_a0;
  value_type local_98;
  BridgeState *new_particle;
  undefined1 local_88 [4];
  int i_1;
  vector<despot::State_*,_std::allocator<despot::State_*>_> new_particles;
  double p;
  int next_pos;
  BridgeState *state;
  double dStack_50;
  int i;
  double sum;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  allocator<double> local_29;
  OBS_TYPE local_28;
  OBS_TYPE obs_local;
  Belief *pBStack_18;
  ACT_TYPE action_local;
  Belief *belief_local;
  Bridge *this_local;
  
  local_28 = obs;
  obs_local._4_4_ = action;
  pBStack_18 = belief;
  belief_local = (Belief *)this;
  if ((Tau(despot::Belief_const*,int,unsigned_long)::probs == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Tau(despot::Belief_const*,int,unsigned_long)::probs), iVar1 != 0)
     ) {
    iVar1 = NumStates(this);
    std::allocator<double>::allocator(&local_29);
    std::vector<double,_std::allocator<double>_>::vector(&Tau::probs,(long)iVar1,&local_29);
    std::allocator<double>::~allocator(&local_29);
    __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,&Tau::probs,&__dso_handle);
    __cxa_guard_release(&Tau(despot::Belief_const*,int,unsigned_long)::probs);
  }
  this_00 = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)
            (**(code **)(*(long *)pBStack_18 + 0x30))();
  dStack_50 = 0.0;
  state._4_4_ = 0;
  do {
    sVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(this_00);
    if (sVar3 <= (ulong)(long)state._4_4_) {
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_88);
      for (new_particle._4_4_ = 0; iVar1 = new_particle._4_4_, iVar2 = NumStates(this),
          iVar1 < iVar2; new_particle._4_4_ = new_particle._4_4_ + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&Tau::probs,(long)new_particle._4_4_);
        if (0.0 < *pvVar5) {
          local_98 = (value_type)(**(code **)(*(long *)this + 0xa8))(0,this,new_particle._4_4_);
          *(int *)(local_98 + 0x20) = new_particle._4_4_;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&Tau::probs,(long)new_particle._4_4_);
          *(double *)(local_98 + 0x18) = *pvVar5 / dStack_50;
          local_a0 = local_98;
          std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                    ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_88,&local_a0
                    );
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&Tau::probs,(long)new_particle._4_4_);
          *pvVar5 = 0.0;
        }
      }
      pPVar6 = (ParticleBelief *)operator_new(0x90);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
                (&local_b8,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_88);
      despot::ParticleBelief::ParticleBelief(pPVar6,&local_b8,this,0);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_b8);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_88);
      return (Belief *)pPVar6;
    }
    ppSVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (this_00,(long)state._4_4_);
    p._4_4_ = *(int *)(*ppSVar4 + 0x20);
    if (obs_local._4_4_ == LEFT) {
      p._4_4_ = p._4_4_ + -1;
      if (p._4_4_ < 0) {
        p._4_4_ = 0;
      }
LAB_0011212c:
      ppSVar7 = (pointer)(*(double *)(*ppSVar4 + 0x18) * (double)(local_28 == 1));
      new_particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ppSVar7;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&Tau::probs,(long)p._4_4_);
      *pvVar5 = (double)ppSVar7 + *pvVar5;
      dStack_50 = (double)new_particles.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + dStack_50;
    }
    else {
      if (obs_local._4_4_ != RIGHT) goto LAB_0011212c;
      if (p._4_4_ < BRIDGELENGTH + -1) {
        p._4_4_ = p._4_4_ + 1;
        goto LAB_0011212c;
      }
    }
    state._4_4_ = state._4_4_ + 1;
  } while( true );
}

Assistant:

Belief* Bridge::Tau(const Belief* belief, ACT_TYPE action, OBS_TYPE obs) const {
	static vector<double> probs = vector<double>(NumStates());

	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double sum = 0;
	for (int i = 0; i < particles.size(); i++) {
		BridgeState* state = static_cast<BridgeState*>(particles[i]);
		int next_pos = state->position;
		if (action == LEFT) {
			next_pos--;
			if (next_pos < 0)
				next_pos = 0;
		} else if (action == RIGHT) {
			if (next_pos < BRIDGELENGTH - 1)
				next_pos++;
			else
				continue;
		}

		double p = state->weight * (obs == 1);
		probs[next_pos] += p;
		sum += p;
	}

	vector<State*> new_particles;
	for (int i = 0; i < NumStates(); i++) {
		if (probs[i] > 0) {
			BridgeState* new_particle = static_cast<BridgeState*>(Allocate(i));
			new_particle->position = i;
			new_particle->weight = probs[i] / sum;
			new_particles.push_back(new_particle);
			probs[i] = 0;
		}
	}

	return new ParticleBelief(new_particles, this, NULL, false);
}